

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O2

int Gia_ObjFanin0CopyRepr(Gia_Man_t *p,Gia_Obj_t *pObj,int *pReprs)

{
  uint Lit;
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  
  iVar2 = Gia_ObjId(p,pObj);
  iVar2 = iVar2 - (*(uint *)pObj & 0x1fffffff);
  if (pReprs[iVar2] == -1) {
    iVar2 = Gia_ObjFanin0Copy(pObj);
    return iVar2;
  }
  iVar3 = Abc_Lit2Var(pReprs[iVar2]);
  iVar4 = Gia_ObjId(p,pObj);
  if (iVar3 < iVar4) {
    iVar3 = Abc_Lit2Var(pReprs[iVar2]);
    pGVar6 = Gia_ManObj(p,iVar3);
    Lit = pGVar6->Value;
    uVar1 = *(uint *)pObj;
    uVar5 = Abc_LitIsCompl(pReprs[iVar2]);
    iVar2 = Abc_LitNotCond(Lit,uVar1 >> 0x1d & 1 ^ uVar5);
    return iVar2;
  }
  __assert_fail("Abc_Lit2Var(pReprs[fanId]) < Gia_ObjId(p, pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                ,0x14f,"int Gia_ObjFanin0CopyRepr(Gia_Man_t *, Gia_Obj_t *, int *)");
}

Assistant:

int Gia_ObjFanin0CopyRepr( Gia_Man_t * p, Gia_Obj_t * pObj, int * pReprs )
{
    int fanId = Gia_ObjFaninId0p( p, pObj );
    if ( pReprs[fanId] == -1 )
        return Gia_ObjFanin0Copy( pObj );
    assert( Abc_Lit2Var(pReprs[fanId]) < Gia_ObjId(p, pObj) );
    return Abc_LitNotCond( Gia_ObjValue(Gia_ManObj(p, Abc_Lit2Var(pReprs[fanId]))), Gia_ObjFaninC0(pObj) ^ Abc_LitIsCompl(pReprs[fanId]) );
}